

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::_OnChangedVtxOffset(ImDrawList *this)

{
  uint uVar1;
  uint uVar2;
  ImTextureID pvVar3;
  ImDrawCmd *pIVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int iVar9;
  ImDrawCmd *pIVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  
  this->_VtxCurrentIdx = 0;
  pIVar10 = (this->CmdBuffer).Data;
  lVar12 = (long)(this->CmdBuffer).Size;
  if (pIVar10[lVar12 + -1].ElemCount == 0) {
    if (pIVar10[lVar12 + -1].UserCallback == (ImDrawCallback)0x0) {
      pIVar10[lVar12 + -1].VtxOffset = (this->_CmdHeader).VtxOffset;
      return;
    }
    __assert_fail("curr_cmd->UserCallback == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_draw.cpp"
                  ,0x218,"void ImDrawList::_OnChangedVtxOffset()");
  }
  fVar5 = (this->_CmdHeader).ClipRect.x;
  fVar6 = (this->_CmdHeader).ClipRect.y;
  fVar7 = (this->_CmdHeader).ClipRect.z;
  fVar8 = (this->_CmdHeader).ClipRect.w;
  if ((fVar5 <= fVar7) && (fVar6 <= fVar8)) {
    pvVar3 = (this->_CmdHeader).TextureId;
    uVar1 = (this->_CmdHeader).VtxOffset;
    uVar2 = (this->IdxBuffer).Size;
    iVar9 = (this->CmdBuffer).Size;
    if (iVar9 == (this->CmdBuffer).Capacity) {
      if (iVar9 == 0) {
        iVar11 = 8;
      }
      else {
        iVar11 = iVar9 / 2 + iVar9;
      }
      iVar13 = iVar9 + 1;
      if (iVar9 + 1 < iVar11) {
        iVar13 = iVar11;
      }
      pIVar10 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar13 * 0x38);
      pIVar4 = (this->CmdBuffer).Data;
      if (pIVar4 != (ImDrawCmd *)0x0) {
        memcpy(pIVar10,pIVar4,(long)(this->CmdBuffer).Size * 0x38);
        ImGui::MemFree((this->CmdBuffer).Data);
      }
      (this->CmdBuffer).Data = pIVar10;
      (this->CmdBuffer).Capacity = iVar13;
      iVar9 = (this->CmdBuffer).Size;
    }
    else {
      pIVar10 = (this->CmdBuffer).Data;
    }
    pIVar4 = pIVar10 + iVar9;
    (pIVar4->ClipRect).x = fVar5;
    (pIVar4->ClipRect).y = fVar6;
    (pIVar4->ClipRect).z = fVar7;
    (pIVar4->ClipRect).w = fVar8;
    pIVar10[iVar9].TextureId = pvVar3;
    pIVar10[iVar9].VtxOffset = uVar1;
    pIVar10[iVar9].IdxOffset = uVar2;
    *(undefined8 *)&pIVar10[iVar9].ElemCount = 0;
    *(ImDrawCallback *)(&pIVar10[iVar9].ElemCount + 2) = (ImDrawCallback)0x0;
    pIVar10[iVar9].UserCallbackData = (void *)0x0;
    (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
    return;
  }
  __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_draw.cpp"
                ,0x1bc,"void ImDrawList::AddDrawCmd()");
}

Assistant:

void ImDrawList::_OnChangedVtxOffset()
{
    // We don't need to compare curr_cmd->VtxOffset != _CmdHeader.VtxOffset because we know it'll be different at the time we call this.
    _VtxCurrentIdx = 0;
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    //IM_ASSERT(curr_cmd->VtxOffset != _CmdHeader.VtxOffset); // See #3349
    if (curr_cmd->ElemCount != 0)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);
    curr_cmd->VtxOffset = _CmdHeader.VtxOffset;
}